

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void setup::anon_unknown_21::load_wizard_images
               (istream *is,version *version,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *images,entry_types entries)

{
  uint uVar1;
  entry_types eVar2;
  long lVar3;
  size_type __new_size;
  bool bVar4;
  
  if (version->value < 0x5060000) {
    __new_size = 1;
  }
  else {
    uVar1 = util::load<int,util::little_endian>(is);
    __new_size = (size_type)uVar1;
  }
  eVar2 = operator|(WizardImages,NoSkip);
  if (((ulong)eVar2._flags.super__Base_bitset<1UL>._M_w &
      (ulong)entries._flags.super__Base_bitset<1UL>._M_w) == 0) {
    while (bVar4 = __new_size != 0, __new_size = __new_size - 1, bVar4) {
      util::binary_string::skip(is);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(images,__new_size);
    for (lVar3 = 0; __new_size * 0x20 != lVar3; lVar3 = lVar3 + 0x20) {
      util::binary_string::load
                (is,(string *)
                    ((long)&(((images->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3
                    ));
    }
    if ((version->value < 0x5060000) &&
       (((images->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(images);
      return;
    }
  }
  return;
}

Assistant:

void load_wizard_images(std::istream & is, const setup::version & version,
                        std::vector<std::string> & images, info::entry_types entries) {
	
	size_t count = 1;
	if(version >= INNO_VERSION(5, 6, 0)) {
		count = util::load<boost::uint32_t>(is);
	}
	
	if(entries & (info::WizardImages | info::NoSkip)) {
		images.resize(count);
		for(size_t i = 0; i < count; i++) {
			is >> util::binary_string(images[i]);
		}
		if(version < INNO_VERSION(5, 6, 0) && images[0].empty()) {
			images.clear();
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			util::binary_string::skip(is);
		}
	}
	
}